

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::value(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  bool bVar1;
  Representation RVar2;
  Type TVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb58;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb60;
  double in_stack_fffffffffffffb68;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_474;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffbf8;
  SPxSense local_3cc;
  undefined1 local_3c8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  SPxSense local_2e8;
  undefined1 local_2e4 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2ac;
  SPxSense local_274;
  undefined1 local_270 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_238;
  undefined8 local_1f0;
  undefined8 local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  undefined1 *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a8;
  undefined8 local_1a0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_191;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_151;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  SPxSense *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  SPxSense *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  SPxSense *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  SPxSense *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  SPxSense *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  SPxSense *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_1d8 = &local_238;
  this_00 = in_RDI;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
  bVar1 = isInitialized(in_RSI);
  if (bVar1) {
    RVar2 = rep(in_RSI);
    if (RVar2 == ROW) {
      TVar3 = type(in_RSI);
      if (TVar3 == LEAVE) {
        local_274 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::spxSense(&in_RSI->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
        coPvec(in_RSI);
        fRhs(in_RSI);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        local_28 = local_270;
        local_30 = &local_274;
        local_38 = &local_2ac;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_38);
        local_20 = local_270;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
        local_8 = local_270;
        local_10 = local_38;
        local_18 = local_30;
        local_48 = (long)*local_30;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,(longlong *)0x2df77b);
        local_1a8 = &local_238;
        local_1b0 = local_270;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58);
      }
      else {
        local_2e8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::spxSense(&in_RSI->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
        nonbasicValue(in_stack_00000118);
        in_stack_fffffffffffffb60 = coPvec(in_RSI);
        fRhs(in_RSI);
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        local_100 = &local_320;
        local_108 = &local_358;
        local_110 = &local_390;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_111,local_108,local_110);
        local_f8 = &local_320;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
        local_e0 = &local_320;
        local_e8 = local_108;
        local_f0 = local_110;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,
                   (cpp_dec_float<50U,_int,_void> *)0x2df8bd);
        local_70 = local_2e4;
        local_78 = &local_2e8;
        local_80 = &local_320;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_81,local_80);
        local_68 = local_2e4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
        local_50 = local_2e4;
        local_58 = local_80;
        local_60 = local_78;
        local_90 = (long)*local_78;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,(longlong *)0x2df97f);
        local_1b8 = &local_238;
        local_1c0 = local_2e4;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                   (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58);
      }
    }
    else {
      local_3cc = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::spxSense(&in_RSI->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
      nonbasicValue(in_stack_00000118);
      in_stack_fffffffffffffb58 = fVec(in_RSI);
      coPrhs(in_RSI);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      local_140 = &stack0xfffffffffffffbfc;
      local_148 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&stack0xfffffffffffffbc4;
      local_150 = &local_474;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_151,local_148,local_150);
      local_138 = &stack0xfffffffffffffbfc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
      local_120 = &stack0xfffffffffffffbfc;
      local_128 = local_148;
      local_130 = local_150;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,
                 (cpp_dec_float<50U,_int,_void> *)0x2dfab3);
      local_b8 = local_3c8;
      local_c0 = &local_3cc;
      local_c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&stack0xfffffffffffffbfc;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_c9,local_c8);
      local_b0 = local_3c8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
      local_98 = local_3c8;
      local_a0 = local_c8;
      local_a8 = local_c0;
      local_d8 = (long)*local_c0;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,(longlong *)0x2dfb75);
      local_1c8 = &local_238;
      local_1d0 = local_3c8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
                 (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58);
    }
    local_190 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::objOffset(&in_RSI->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           );
    local_188 = &local_238;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_191,local_188,local_190);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60);
    local_168 = local_188;
    local_170 = local_190;
    boost::multiprecision::default_ops::
    eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb60,
               (cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb58,
               (cpp_dec_float<50U,_int,_void> *)0x2dfc5a);
  }
  else {
    local_1e8 = infinity();
    local_1f0 = 0;
    local_1a0 = local_1e8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (this_00,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }